

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_polygon_mesh.cpp
# Opt level: O3

string * __thiscall
geometrycentral::surface::SimplePolygonMesh::detectFileType
          (string *__return_storage_ptr__,SimplePolygonMesh *this,string *filename)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Alloc_hider _Var2;
  size_type sVar3;
  int iVar4;
  long lVar5;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var6;
  runtime_error *prVar7;
  long *plVar8;
  size_type *psVar9;
  size_type sVar10;
  string extension;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  lVar5 = ::std::__cxx11::string::rfind((char)filename,0x2e);
  local_98 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_98;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (lVar5 == -1) {
    prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
    ::std::operator+(&local_b8,"Could not auto-detect file type to load mesh from ",filename);
    ::std::runtime_error::runtime_error(prVar7,(string *)&local_b8);
    __cxa_throw(prVar7,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
  }
  paVar1 = &local_b8.field_2;
  local_b8._M_string_length = 0;
  local_b8.field_2._M_allocated_capacity =
       local_b8.field_2._M_allocated_capacity & 0xffffffffffffff00;
  local_b8._M_dataplus._M_p = (pointer)paVar1;
  ::std::__cxx11::string::substr((ulong)&local_90,(ulong)filename);
  ::std::__cxx11::string::operator=((string *)&local_b8,(string *)&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  sVar3 = local_b8._M_string_length;
  _Var2._M_p = local_b8._M_dataplus._M_p;
  if (local_b8._M_string_length != 0) {
    sVar10 = 0;
    do {
      iVar4 = tolower((int)_Var2._M_p[sVar10]);
      _Var2._M_p[sVar10] = (char)iVar4;
      sVar10 = sVar10 + 1;
    } while (sVar3 != sVar10);
  }
  ::std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  _Var6 = ::std::
          __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                    ((anonymous_namespace)::supportedMeshTypes_abi_cxx11_,DAT_004baa88,
                     __return_storage_ptr__);
  if (_Var6._M_current != DAT_004baa88) {
    return __return_storage_ptr__;
  }
  prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
  ::std::operator+(&local_50,"Detected file type ",__return_storage_ptr__);
  plVar8 = (long *)::std::__cxx11::string::append((char *)&local_50);
  psVar9 = (size_type *)(plVar8 + 2);
  local_70._M_dataplus._M_p = (pointer)*plVar8;
  if ((size_type *)local_70._M_dataplus._M_p == psVar9) {
    local_70.field_2._M_allocated_capacity = *psVar9;
    local_70.field_2._8_8_ = plVar8[3];
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  }
  else {
    local_70.field_2._M_allocated_capacity = *psVar9;
  }
  local_70._M_string_length = plVar8[1];
  *plVar8 = (long)psVar9;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  ::std::operator+(&local_90,&local_70,filename);
  plVar8 = (long *)::std::__cxx11::string::append((char *)&local_90);
  psVar9 = (size_type *)(plVar8 + 2);
  local_b8._M_dataplus._M_p = (pointer)*plVar8;
  if ((size_type *)local_b8._M_dataplus._M_p == psVar9) {
    local_b8.field_2._M_allocated_capacity = *psVar9;
    local_b8.field_2._8_8_ = plVar8[3];
    local_b8._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_b8.field_2._M_allocated_capacity = *psVar9;
  }
  local_b8._M_string_length = plVar8[1];
  *plVar8 = (long)psVar9;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  ::std::runtime_error::runtime_error(prVar7,(string *)&local_b8);
  __cxa_throw(prVar7,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

std::string SimplePolygonMesh::detectFileType(std::string filename) {
  std::string::size_type sepInd = filename.rfind('.');
  std::string type;

  if (sepInd != std::string::npos) {
    std::string extension;
    extension = filename.substr(sepInd + 1);

    // Convert to all lowercase
    std::transform(extension.begin(), extension.end(), extension.begin(), ::tolower);
    type = extension;
  } else {
    throw std::runtime_error("Could not auto-detect file type to load mesh from " + filename);
  }

  // Check if this is one of the filetypes we're aware of
  if (std::find(std::begin(supportedMeshTypes), std::end(supportedMeshTypes), type) == std::end(supportedMeshTypes)) {
    throw std::runtime_error("Detected file type " + type + " to load mesh from " + filename +
                             ". This is not a supported file type.");
  }

  return type;
}